

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmObjDate::format_string_buf(CVmObjDate *this,char *buf,size_t buflen)

{
  CVmDateLocale lc;
  gregcaldate_t date;
  char *tzabbr;
  int32_t tzofs;
  int32_t daytime;
  int32_t dayno;
  CVmDateLocale *in_stack_00000138;
  size_t in_stack_00000140;
  char *in_stack_00000148;
  size_t in_stack_00000150;
  char *in_stack_00000158;
  CVmObjDate *in_stack_00000160;
  multicaldate_t *in_stack_00000180;
  int32_t in_stack_00000188;
  int32_t in_stack_00000190;
  char *in_stack_00000198;
  int32_t in_stack_000001a0;
  CVmTimeZoneCache *in_stack_00000218;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff6c;
  gregcaldate_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  CVmDateLocale *in_stack_ffffffffffffff80;
  
  CVmTimeZoneCache::get_local_zone(in_stack_00000218);
  get_local_time((CVmObjDate *)in_stack_ffffffffffffff80,
                 (int32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int32_t *)in_stack_ffffffffffffff70,
                 (int32_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (CVmTimeZone *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  gregcaldate_t::gregcaldate_t(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  CVmDateLocale::CVmDateLocale(in_stack_ffffffffffffff80);
  format_date(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148,
              in_stack_00000140,in_stack_00000138,in_stack_00000180,in_stack_00000188,
              in_stack_00000190,in_stack_00000198,in_stack_000001a0);
  gregcaldate_t::~gregcaldate_t((gregcaldate_t *)0x2f13b0);
  return;
}

Assistant:

void CVmObjDate::format_string_buf(VMG_ char *buf, size_t buflen) const
{
    /* get the day number and time of day in local time */
    int32_t dayno, daytime, tzofs;
    const char *tzabbr = get_local_time(
        dayno, daytime, tzofs, G_tzcache->get_local_zone(vmg0_));

    /* convert the day number to a calendar date */
    gregcaldate_t date(dayno);

    /* format using a default template */
    CVmDateLocale lc Pvmg0_P;
    format_date(vmg_ buf, buflen, "%Y-%m-%d %H:%M:%S", 17, &lc,
                &date, dayno, daytime, tzabbr, tzofs);
}